

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFont::AddRemapChar(ImFont *this,ImWchar dst,ImWchar src,bool overwrite_dst)

{
  int iVar1;
  value_type_conflict *pvVar2;
  value_type_conflict1 *pvVar3;
  value_type_conflict1 local_30;
  value_type_conflict local_2a;
  int index_size;
  bool overwrite_dst_local;
  ImWchar src_local;
  ImWchar dst_local;
  ImFont *this_local;
  
  if ((this->IndexLookup).Size < 1) {
    __assert_fail("IndexLookup.Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                  ,0x6e7,"void ImFont::AddRemapChar(ImWchar, ImWchar, bool)");
  }
  iVar1 = (this->IndexLookup).Size;
  if ((((iVar1 <= (int)(uint)dst) || ((this->IndexLookup).Data[dst] != 0xffff)) || (overwrite_dst))
     && (((int)(uint)src < iVar1 || ((int)(uint)dst < iVar1)))) {
    GrowIndex(this,dst + 1);
    if ((int)(uint)src < iVar1) {
      local_2a = (this->IndexLookup).Data[src];
    }
    else {
      local_2a = 0xffff;
    }
    pvVar2 = ImVector<unsigned_short>::operator[](&this->IndexLookup,(uint)dst);
    *pvVar2 = local_2a;
    if ((int)(uint)src < iVar1) {
      local_30 = (this->IndexXAdvance).Data[src];
    }
    else {
      local_30 = 1.0;
    }
    pvVar3 = ImVector<float>::operator[](&this->IndexXAdvance,(uint)dst);
    *pvVar3 = local_30;
  }
  return;
}

Assistant:

void ImFont::AddRemapChar(ImWchar dst, ImWchar src, bool overwrite_dst)
{
    IM_ASSERT(IndexLookup.Size > 0);    // Currently this can only be called AFTER the font has been built, aka after calling ImFontAtlas::GetTexDataAs*() function.
    int index_size = IndexLookup.Size;

    if (dst < index_size && IndexLookup.Data[dst] == (unsigned short)-1 && !overwrite_dst) // 'dst' already exists
        return;
    if (src >= index_size && dst >= index_size) // both 'dst' and 'src' don't exist -> no-op
        return;

    GrowIndex(dst + 1);
    IndexLookup[dst] = (src < index_size) ? IndexLookup.Data[src] : (unsigned short)-1;
    IndexXAdvance[dst] = (src < index_size) ? IndexXAdvance.Data[src] : 1.0f;
}